

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralPointAction::~IfcStructuralPointAction
          (IfcStructuralPointAction *this)

{
  undefined1 *this_00;
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  this_00 = &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.
             super_IfcObject.field_0x28;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0x28 = 0x8c8b28;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0x10 = 0x8c8c18;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.field_0x18 = 0x8c8b50;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0xc0 = 0x8c8b78;
  *(undefined8 *)
   &this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.super_IfcProduct.Representation.
    have = 0x8c8ba0;
  this[-1].super_IfcStructuralAction.super_IfcStructuralActivity.GlobalOrLocal.field_2.
  _M_allocated_capacity = 0x8c8bc8;
  *(undefined8 *)&this[-1].super_IfcStructuralAction.field_0x160 = 0x8c8bf0;
  puVar1 = *(undefined1 **)&this[-1].super_IfcStructuralAction.CausedBy.have;
  puVar2 = &this[-1].super_IfcStructuralAction.field_0x180;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  IfcStructuralActivity::~IfcStructuralActivity
            ((IfcStructuralActivity *)this_00,&PTR_construction_vtable_24__008c8998);
  operator_delete(this_00,0x1a0);
  return;
}

Assistant:

IfcStructuralPointAction() : Object("IfcStructuralPointAction") {}